

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O1

size_t __thiscall
gmlc::concurrency::DelayedDestructor<helics::Core>::destroyObjects
          (DelayedDestructor<helics::Core> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  __normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
  __first;
  iterator __end0;
  iterator __begin0;
  pointer psVar3;
  shared_ptr<helics::Core> *psVar4;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *this_00;
  pointer psVar5;
  function<void_(std::shared_ptr<helics::Core>_&)> deleteFunc;
  vector<void_*,_std::allocator<void_*>_> epointers;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> ecall;
  unique_lock<std::timed_mutex> lock;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *__range4;
  milliseconds wait;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  void *local_88;
  void *pvStack_80;
  long local_78;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> local_68;
  unique_lock<std::timed_mutex> local_50;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  local_38.__r = 200;
  local_50._M_owns = false;
  local_50._M_device = &this->destructionLock;
  bVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    (&local_50,&local_38);
  this_00 = (vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
             *)0xffffffffffffffff;
  if (bVar2) {
    psVar3 = (this->ElementsToBeDestroyed).
             super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (this->ElementsToBeDestroyed).
             super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar5 != psVar3) {
      local_40 = &this->ElementsToBeDestroyed;
      this_00 = &local_68;
      local_68.
      super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (shared_ptr<helics::Core> *)0x0;
      local_68.
      super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (shared_ptr<helics::Core> *)0x0;
      local_68.
      super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78 = 0;
      local_88 = (void *)0x0;
      pvStack_80 = (void *)0x0;
      do {
        p_Var1 = (psVar3->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var1->_M_use_count == 1)) {
          std::
          vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
          push_back(this_00,psVar3);
          local_a8._M_unused._M_object =
               (psVar3->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::vector<void*,std::allocator<void*>>::emplace_back<helics::Core*>
                    ((vector<void*,std::allocator<void*>> *)&local_88,(Core **)&local_a8);
        }
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar5);
      if (local_88 == pvStack_80) {
        bVar2 = true;
      }
      else {
        __first = std::
                  __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<helics::Core>*,std::vector<std::shared_ptr<helics::Core>,std::allocator<std::shared_ptr<helics::Core>>>>,__gnu_cxx::__ops::_Iter_pred<gmlc::concurrency::DelayedDestructor<helics::Core>::destroyObjects()::_lambda(auto:1_const&)_1_>>
                            ((this->ElementsToBeDestroyed).
                             super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->ElementsToBeDestroyed).
                             super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_concurrency_gmlc_concurrency_DelayedDestructor_hpp:106:40)>
                              )&local_88);
        std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
        ::_M_erase(local_40,(iterator)__first._M_current,
                   (this->ElementsToBeDestroyed).
                   super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        this_00 = (vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                   *)((long)(this->ElementsToBeDestroyed).
                            super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->ElementsToBeDestroyed).
                            super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
        std::function<void_(std::shared_ptr<helics::Core>_&)>::function
                  ((function<void_(std::shared_ptr<helics::Core>_&)> *)&local_a8,
                   &this->callBeforeDeleteFunction);
        std::unique_lock<std::timed_mutex>::unlock(&local_50);
        psVar3 = local_68.
                 super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((local_98 != (code *)0x0) &&
           (local_68.
            super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          psVar5 = local_68.
                   super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (local_98 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*local_90)(&local_a8,psVar5);
            psVar5 = psVar5 + 1;
          } while (psVar5 != psVar3);
        }
        psVar5 = local_68.
                 super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar3 = local_68.
                 super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = local_68.
                 super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_68.
            super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_68.
            super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            p_Var1 = (psVar4->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            psVar4 = psVar4 + 1;
          } while (psVar4 != psVar5);
          local_68.
          super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar3;
        }
        bVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                          (&local_50,&local_38);
        if (local_98 != (code *)0x0) {
          (*local_98)((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
        }
      }
      if (local_88 != (void *)0x0) {
        operator_delete(local_88,local_78 - (long)local_88);
      }
      std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
      ~vector(&local_68);
      if (bVar2 == false) goto LAB_002e5057;
    }
    this_00 = (vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
               *)((long)(this->ElementsToBeDestroyed).
                        super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->ElementsToBeDestroyed).
                        super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  }
LAB_002e5057:
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_50);
  return (size_t)this_00;
}

Assistant:

size_t destroyObjects() noexcept
    {
        std::size_t elementSize{static_cast<std::size_t>(-1)};
        std::chrono::milliseconds wait(std::chrono::milliseconds(200));
        try {
            std::unique_lock<std::timed_mutex> lock(destructionLock,
                                                    std::defer_lock);
            if (!lock.try_lock_for(wait)) {
                return elementSize;
            }
            elementSize = ElementsToBeDestroyed.size();
            if (elementSize > 0) {
                std::vector<std::shared_ptr<X>> ecall;
                std::vector<void*> epointers;
                for (auto& element : ElementsToBeDestroyed) {
                    if (element.use_count() == 1) {
                        ecall.push_back(element);
                        epointers.emplace_back(element.get());
                    }
                }
                if (!epointers.empty()) {
                    // so apparently remove_if can actually call the
                    // destructor for shared_ptrs so the call function needs
                    // to be before this call
                    auto loc =
                        std::remove_if(ElementsToBeDestroyed.begin(),
                                       ElementsToBeDestroyed.end(),
                                       [&epointers](const auto& element) {
                                           return (
                                               (element.use_count() == 2) &&
                                               (std::find(epointers.begin(),
                                                          epointers.end(),
                                                          static_cast<void*>(
                                                              element.get())) !=
                                                epointers.end()));
                                       });
                    ElementsToBeDestroyed.erase(loc,
                                                ElementsToBeDestroyed.end());
                    elementSize = ElementsToBeDestroyed.size();
                    auto deleteFunc = callBeforeDeleteFunction;
                    lock.unlock();
                    // this needs to be done after the lock, so a destructor
                    // can never called while under the lock
                    if (deleteFunc) {
                        for (auto& element : ecall) {
                            deleteFunc(element);
                        }
                    }
                    ecall.clear();  // make sure the destructors get called
                                    // before returning.
                    // reengage the lock so the size is correct
                    if (!lock.try_lock_for(wait)) {
                        return elementSize;
                    }
                }
            }
            return ElementsToBeDestroyed.size();
        }
        catch (...) {
        }
        return elementSize;
    }